

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

char * Bac_NtkGenerateName(Bac_Ntk_t *p,Bac_ObjType_t Type,Vec_Int_t *vBits)

{
  int iVar1;
  Bac_Man_t *pBVar2;
  char *__s;
  size_t sVar3;
  long lVar4;
  char *__s_00;
  
  pBVar2 = p->pDesign;
  __s = pBVar2->pPrimSymbs[Type];
  iVar1 = vBits->nSize;
  sVar3 = strlen(__s);
  if (iVar1 == (int)sVar3) {
    sprintf(Bac_NtkGenerateName::Buffer,"%s%s_","ABC_",pBVar2->pPrimNames[Type]);
    if (0 < vBits->nSize) {
      sVar3 = strlen(Bac_NtkGenerateName::Buffer);
      __s_00 = Bac_NtkGenerateName::Buffer + sVar3;
      lVar4 = 0;
      do {
        sprintf(__s_00,"%c%d",(ulong)(uint)(int)__s[lVar4],(ulong)(uint)vBits->pArray[lVar4]);
        sVar3 = strlen(__s_00);
        __s_00 = __s_00 + sVar3;
        lVar4 = lVar4 + 1;
      } while (lVar4 < vBits->nSize);
    }
    return Bac_NtkGenerateName::Buffer;
  }
  __assert_fail("Vec_IntSize(vBits) == (int)strlen(pSymb)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                ,0x94,"char *Bac_NtkGenerateName(Bac_Ntk_t *, Bac_ObjType_t, Vec_Int_t *)");
}

Assistant:

char * Bac_NtkGenerateName( Bac_Ntk_t * p, Bac_ObjType_t Type, Vec_Int_t * vBits )
{
    static char Buffer[100]; 
    char * pTemp; int i, Bits;
    char * pName = Bac_ManPrimName( p->pDesign, Type );
    char * pSymb = Bac_ManPrimSymb( p->pDesign, Type );
    assert( Vec_IntSize(vBits) == (int)strlen(pSymb) );
    sprintf( Buffer, "%s%s_", s_Pref, pName );
    pTemp = Buffer + strlen(Buffer);
    Vec_IntForEachEntry( vBits, Bits, i )
    {
        sprintf( pTemp, "%c%d", pSymb[i], Bits );
        pTemp += strlen(pTemp);
    }
    //Vec_IntPrint( vBits );
    //printf( "%s\n", Buffer );
    return Buffer;
}